

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O1

Iterator<false> * __thiscall
bitdeque<32768>::Iterator<false>::operator+=(Iterator<false> *this,difference_type dist)

{
  long lVar1;
  _Map_pointer ppbVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  bitset<32768UL> *pbVar6;
  _Elt_pointer pbVar7;
  int iVar8;
  long lVar9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dist < 1) {
    if (-1 < dist) goto LAB_0087ff0f;
    lVar5 = -dist;
    uVar3 = (ulong)this->m_bitpos;
    if (-uVar3 != dist && (long)uVar3 <= lVar5) {
      if ((this->m_it)._M_cur == (this->m_it)._M_first) {
        ppbVar2 = (this->m_it)._M_node;
        (this->m_it)._M_node = ppbVar2 + -1;
        pbVar6 = ppbVar2[-1];
        (this->m_it)._M_first = pbVar6;
        pbVar6 = pbVar6 + 1;
        (this->m_it)._M_last = pbVar6;
        (this->m_it)._M_cur = pbVar6;
      }
      (this->m_it)._M_cur = (this->m_it)._M_cur + -1;
      lVar5 = lVar5 + ~uVar3;
      this->m_bitpos = 0x7fff;
    }
    lVar9 = lVar5 + 0x7fff;
    if (-1 < lVar5) {
      lVar9 = lVar5;
    }
    lVar9 = lVar9 >> 0xf;
    pbVar7 = (this->m_it)._M_cur;
    lVar4 = ((long)pbVar7 - (long)(this->m_it)._M_first >> 0xc) - lVar9;
    if (lVar4 == 0) {
      pbVar7 = pbVar7 + -lVar9;
    }
    else {
      ppbVar2 = (this->m_it)._M_node + lVar4;
      (this->m_it)._M_node = ppbVar2;
      pbVar7 = *ppbVar2;
      (this->m_it)._M_first = pbVar7;
      (this->m_it)._M_last = pbVar7 + 1;
    }
    (this->m_it)._M_cur = pbVar7;
    iVar8 = (int)lVar9 * 0x8000 - (int)lVar5;
  }
  else {
    iVar8 = this->m_bitpos;
    if (0x7fff < iVar8 + dist) {
      pbVar7 = (this->m_it)._M_cur + 1;
      (this->m_it)._M_cur = pbVar7;
      if (pbVar7 == (this->m_it)._M_last) {
        ppbVar2 = (this->m_it)._M_node;
        (this->m_it)._M_node = ppbVar2 + 1;
        pbVar6 = ppbVar2[1];
        (this->m_it)._M_first = pbVar6;
        (this->m_it)._M_last = pbVar6 + 1;
        (this->m_it)._M_cur = pbVar6;
      }
      dist = dist + iVar8 + -0x8000;
      this->m_bitpos = 0;
    }
    lVar5 = dist + 0x7fff;
    if (-1 < dist) {
      lVar5 = dist;
    }
    lVar5 = lVar5 >> 0xf;
    pbVar7 = (this->m_it)._M_cur;
    lVar9 = ((long)pbVar7 - (long)(this->m_it)._M_first >> 0xc) + lVar5;
    if (lVar9 == 0) {
      pbVar7 = pbVar7 + lVar5;
    }
    else {
      ppbVar2 = (this->m_it)._M_node + lVar9;
      (this->m_it)._M_node = ppbVar2;
      pbVar7 = *ppbVar2;
      (this->m_it)._M_first = pbVar7;
      (this->m_it)._M_last = pbVar7 + 1;
    }
    (this->m_it)._M_cur = pbVar7;
    iVar8 = (int)dist + (int)lVar5 * -0x8000;
  }
  this->m_bitpos = this->m_bitpos + iVar8;
LAB_0087ff0f:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

Iterator& operator+=(difference_type dist)
        {
            if (dist > 0) {
                if (dist + m_bitpos >= BITS_PER_WORD) {
                    ++m_it;
                    dist -= BITS_PER_WORD - m_bitpos;
                    m_bitpos = 0;
                }
                auto jump = dist / BITS_PER_WORD;
                m_it += jump;
                m_bitpos += dist - jump * BITS_PER_WORD;
            } else if (dist < 0) {
                dist = -dist;
                if (dist > m_bitpos) {
                    --m_it;
                    dist -= m_bitpos + 1;
                    m_bitpos = BITS_PER_WORD - 1;
                }
                auto jump = dist / BITS_PER_WORD;
                m_it -= jump;
                m_bitpos -= dist - jump * BITS_PER_WORD;
            }
            return *this;
        }